

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall
StringInstance::StringInstance
          (StringInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *psVar1;
  bool bVar2;
  undefined8 *puVar3;
  char *pcVar4;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_60,"String",(allocator *)&local_40);
  Instance::Instance(&this->super_Instance,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__StringInstance_0017bee0;
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  (this->_value)._M_string_length = 0;
  (this->_value).field_2._M_local_buf[0] = '\0';
  bVar2 = std::operator==(message_name,"create:");
  if ((bVar2) || (bVar2 = std::operator==(message_name,"createIfNotExists:"), bVar2)) {
    psVar1 = (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(arguments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 == 0x20) {
      bVar2 = Grammar::is_variable(psVar1);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&(this->super_Instance)._name);
        std::__cxx11::string::assign((char *)&this->_value);
        return;
      }
      pcVar4 = "RuntimeError: invalid argument.";
      goto LAB_001533ae;
    }
  }
  else {
    bVar2 = std::operator==(message_name,"create:withValue:");
    if ((!bVar2) && (bVar2 = std::operator==(message_name,"createIfNotExists:withValue:"), !bVar2))
    {
      pcVar4 = "RuntimeError: invalid message.";
      goto LAB_001533ae;
    }
    psVar1 = (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(arguments->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 == 0x40) {
      bVar2 = Grammar::is_variable(psVar1);
      pcVar4 = "RuntimeError: invalid argument.";
      if ((bVar2) &&
         (bVar2 = Grammar::is_string_value
                            ((arguments->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1), bVar2)) {
        std::__cxx11::string::_M_assign((string *)&(this->super_Instance)._name);
        std::__cxx11::string::substr
                  ((ulong)&local_40,
                   (ulong)((arguments->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1));
        str_utils::unescape(&local_60,&local_40,'\"');
        std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
        return;
      }
      goto LAB_001533ae;
    }
  }
  pcVar4 = "RuntimeError: wrong number of arguments.";
LAB_001533ae:
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = pcVar4;
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

StringInstance::StringInstance(const std::string& message_name, const std::vector<std::string>& arguments) :
    Instance("String") {
    if (message_name == "create:" || message_name == "createIfNotExists:") {
        if (arguments.size() != 1)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = "";
    }
    else if (message_name == "create:withValue:" || message_name == "createIfNotExists:withValue:") {
        if (arguments.size() != 2)
            throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
        if (!Grammar::is_variable(arguments[0]) || !Grammar::is_string_value(arguments[1]))
            throw EXC_INVALID_ARGUMENT;
        _name = arguments[0];
        _value = str_utils::unescape(arguments[1].substr(1, int(arguments[1].size()) - 2), '"');
    }
    else
        throw EXC_INVALID_MESSAGE;
}